

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O2

mat3f * inverse(mat3f a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  float *in_RDI;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  *(undefined8 *)(in_RDI + 2) = 0;
  in_RDI[8] = 0.0;
  uVar3 = 0;
  pfVar7 = in_RDI;
  while (uVar3 != 3) {
    uVar1 = uVar3 + 1;
    uVar5 = uVar1 & 0xffffffff;
    if (uVar1 == 3) {
      uVar5 = 0;
    }
    uVar3 = (ulong)((int)uVar3 + 2) % 3;
    uVar4 = 0xffffffff;
    uVar8 = 0;
    for (lVar10 = 0; lVar10 != 0x24; lVar10 = lVar10 + 0xc) {
      uVar2 = uVar8 + 1;
      uVar6 = 0;
      if (uVar2 != 3) {
        uVar6 = uVar2 & 0xffffffff;
      }
      uVar9 = (ulong)uVar4;
      if (uVar8 == 0) {
        uVar9 = 2;
      }
      *(float *)((long)pfVar7 + lVar10) =
           ((&stack0x00000008)[uVar5 * 3 + uVar6] * (&stack0x00000008)[uVar3 * 3 + uVar9] -
           (&stack0x00000008)[uVar5 * 3 + uVar9] * (&stack0x00000008)[uVar3 * 3 + uVar6]) *
           (1.0 / ((((in_stack_00000010 * in_stack_00000014 * in_stack_00000024 +
                     in_stack_00000008 * in_stack_00000018 * in_stack_00000028 +
                     in_stack_0000000c * in_stack_0000001c * in_stack_00000020) -
                    in_stack_0000001c * in_stack_00000008 * in_stack_00000024) -
                   in_stack_00000014 * in_stack_0000000c * in_stack_00000028) -
                  in_stack_00000018 * in_stack_00000010 * in_stack_00000020));
      uVar4 = uVar4 + 1;
      uVar8 = uVar2;
    }
    pfVar7 = pfVar7 + 1;
    uVar3 = uVar1;
  }
  return (mat3f *)in_RDI;
}

Assistant:

inline mat3f inverse(mat3f a)
{
	float invdet = 1/det(a);
	mat3f res;
	for (int i=0; i<3; ++i)
		for (int j=0; j<3; ++j)
			res[j][i] = (a[(i+1)%3][(j+1)%3] * a[(i+2)%3][(j+2)%3] - a[(i+2)%3][(j+1)%3] * a[(i+1)%3][(j+2)%3]) * invdet;
	return res;
}